

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::argument_loader<Strider*,long,int,int,int,int,float,float,bool>::
load_impl_sequence<0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul>(void *param_1,long param_2)

{
  initializer_list<bool> *this;
  reference pvVar1;
  __tuple_element_t<3UL,_tuple<type_caster<Strider,_void>,_type_caster<long,_void>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<bool>_>_>
  *__n;
  vector<bool,_std::allocator<bool>_> *this_00;
  handle src;
  __tuple_element_t<7UL,_tuple<type_caster<Strider,_void>,_type_caster<long,_void>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<int,_void>,_type_caster<float,_void>,_type_caster<float,_void>,_type_caster<bool>_>_>
  *p_Var2;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<bool> *__range3;
  type_caster_generic *in_stack_fffffffffffffe88;
  handle in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffeb8;
  undefined1 uVar4;
  handle in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  handle in_stack_fffffffffffffed8;
  const_iterator local_120;
  reference local_118;
  PyObject *local_108;
  reference local_100;
  PyObject *local_f0;
  reference local_e8;
  PyObject *local_d8;
  reference local_d0;
  PyObject *local_c0;
  reference local_b8;
  PyObject *local_a8;
  reference local_a0;
  PyObject *local_90;
  reference local_88;
  PyObject *local_78;
  reference local_70;
  PyObject *local_60;
  reference local_58;
  PyObject *local_48;
  bool local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  uVar4 = (undefined1)((ulong)in_stack_fffffffffffffeb8 >> 0x38);
  local_18 = param_2;
  local_10 = param_1;
  this = (initializer_list<bool> *)
         std::
         get<0ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                   ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                     *)0x46b849);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_48 = pvVar1->m_ptr;
  local_58 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::_Bit_reference::operator_cast_to_bool(&local_58);
  local_39 = type_caster_generic::load
                       (in_stack_fffffffffffffe88,in_stack_fffffffffffffe90,
                        SUB81((ulong)this >> 0x38,0));
  std::
  get<1ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x46b8cb);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_60 = pvVar1->m_ptr;
  local_70 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::_Bit_reference::operator_cast_to_bool(&local_70);
  local_38 = type_caster<long,_void>::load
                       ((type_caster<long,_void> *)
                        CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffed8,
                        SUB81((ulong)in_stack_fffffffffffffec8.m_ptr >> 0x38,0));
  std::
  get<2ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x46b94f);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      2);
  local_78 = pvVar1->m_ptr;
  local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::_Bit_reference::operator_cast_to_bool(&local_88);
  local_37 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)
                        CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffed8,
                        SUB81((ulong)in_stack_fffffffffffffec8.m_ptr >> 0x38,0));
  __n = std::
        get<3ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                  ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                    *)0x46b9d3);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      3);
  local_90 = pvVar1->m_ptr;
  local_a0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_fffffffffffffea0,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool(&local_a0);
  local_36 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)
                        CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffed8,
                        SUB81((ulong)in_stack_fffffffffffffec8.m_ptr >> 0x38,0));
  this_00 = (vector<bool,_std::allocator<bool>_> *)
            std::
            get<4ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                      ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                        *)0x46ba57);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      4);
  local_a8 = pvVar1->m_ptr;
  local_b8 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool(&local_b8);
  local_35 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)
                        CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffed8,
                        SUB81((ulong)in_stack_fffffffffffffec8.m_ptr >> 0x38,0));
  src.m_ptr = (PyObject *)
              std::
              get<5ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                        ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                          *)0x46badb);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      5);
  local_c0 = pvVar1->m_ptr;
  local_d0 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool(&local_d0);
  local_34 = type_caster<int,_void>::load
                       ((type_caster<int,_void> *)
                        CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
                        in_stack_fffffffffffffed8,
                        SUB81((ulong)in_stack_fffffffffffffec8.m_ptr >> 0x38,0));
  std::
  get<6ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x46bb5f);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      6);
  local_d8 = pvVar1->m_ptr;
  local_e8 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool(&local_e8);
  local_33 = type_caster<float,_void>::load
                       ((type_caster<float,_void> *)param_1,in_stack_fffffffffffffec8,(bool)uVar4);
  p_Var2 = std::
           get<7ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
                     ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
                       *)0x46bbe3);
  uVar4 = (undefined1)((ulong)p_Var2 >> 0x38);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      7);
  local_f0 = pvVar1->m_ptr;
  local_100 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  std::_Bit_reference::operator_cast_to_bool(&local_100);
  local_32 = type_caster<float,_void>::load
                       ((type_caster<float,_void> *)param_1,in_stack_fffffffffffffec8,(bool)uVar4);
  std::
  get<8ul,pybind11::detail::type_caster<Strider,void>,pybind11::detail::type_caster<long,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<int,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<float,void>,pybind11::detail::type_caster<bool,void>>
            ((tuple<pybind11::detail::type_caster<Strider,_void>,_pybind11::detail::type_caster<long,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<int,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<float,_void>,_pybind11::detail::type_caster<bool,_void>_>
              *)0x46bc67);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      8);
  local_108 = pvVar1->m_ptr;
  local_118 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(size_type)__n);
  uVar4 = (undefined1)((ulong)__n >> 0x38);
  std::_Bit_reference::operator_cast_to_bool(&local_118);
  local_31 = type_caster<bool,_void>::load((type_caster<bool,_void> *)this_00,src,(bool)uVar4);
  local_30._M_array = &local_39;
  local_30._M_len = 9;
  local_20 = &local_30;
  local_120 = std::initializer_list<bool>::begin(local_20);
  pbVar3 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (local_120 == pbVar3) {
      return true;
    }
    if ((*local_120 & 1U) == 0) break;
    local_120 = local_120 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }